

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

Guid __thiscall Jinx::Variant::GetGuid(Variant *this)

{
  bool bVar1;
  Guid GVar2;
  Variant v;
  
  if (this->m_type == Guid) {
    GVar2 = (this->field_1).m_guid;
  }
  else {
    Copy(&v,this);
    bVar1 = ConvertTo(&v,Guid);
    if (bVar1) {
      GVar2 = GetGuid(&v);
    }
    else {
      GVar2 = (Guid)ZEXT816(0);
    }
    Destroy(&v);
  }
  return GVar2;
}

Assistant:

inline_t Guid Variant::GetGuid() const
	{
		if (IsGuid())
			return m_guid;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Guid))
			return NullGuid;
		return v.GetGuid();
	}